

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::clara::detail::Opt::Opt(Opt *this,bool *ref)

{
  shared_ptr<Catch::clara::detail::BoundFlagRef> local_38;
  shared_ptr<Catch::clara::detail::BoundRef> local_28;
  bool *local_18;
  bool *ref_local;
  Opt *this_local;
  
  local_18 = ref;
  ref_local = (bool *)this;
  ::std::make_shared<Catch::clara::detail::BoundFlagRef,bool&>((bool *)&local_38);
  ::std::shared_ptr<Catch::clara::detail::BoundRef>::
  shared_ptr<Catch::clara::detail::BoundFlagRef,void>(&local_28,&local_38);
  ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl
            (&this->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_28);
  std::shared_ptr<Catch::clara::detail::BoundRef>::~shared_ptr(&local_28);
  std::shared_ptr<Catch::clara::detail::BoundFlagRef>::~shared_ptr(&local_38);
  (this->super_ParserRefImpl<Catch::clara::detail::Opt>).
  super_ComposableParserImpl<Catch::clara::detail::Opt>.super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__Opt_00406910;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_optNames);
  return;
}

Assistant:

explicit Opt( bool &ref ) : ParserRefImpl( std::make_shared<BoundFlagRef>( ref ) ) {}